

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

void __thiscall EPoller::fillActiveChannels(EPoller *this,int numEvents,ChannelList *activeChannels)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  const_iterator cVar2;
  long lVar3;
  undefined1 local_48 [8];
  shared_ptr<Channel> channel;
  int fd;
  
  if (0 < numEvents) {
    lVar3 = 0;
    do {
      channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           *(undefined4 *)
            ((long)&((this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                     _M_impl.super__Vector_impl_data._M_start)->data + lVar3);
      cVar2 = std::
              _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->channels_)._M_h,
                     (key_type *)
                     ((long)&channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
      if (cVar2.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>.
          _M_cur == (__node_type *)0x0) {
        __assert_fail("it != channels_.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                      ,0x27,"void EPoller::fillActiveChannels(int, ChannelList *) const");
      }
      local_48 = *(undefined1 (*) [8])
                  ((long)cVar2.
                         super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>
                         ._M_cur + 0x10);
      channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>
                   ._M_cur + 0x18);
      if (channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &((channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<Channel>)._M_weak_this.
                    super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = &((channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<Channel>)._M_weak_this.
                    super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
      ((element_type *)local_48)->revents_ =
           *(int *)((long)&((this->events_).
                            super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
                            super__Vector_impl_data._M_start)->events + lVar3);
      std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::push_back
                (activeChannels,(value_type *)local_48);
      if (channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      lVar3 = lVar3 + 0xc;
    } while ((ulong)(uint)numEvents * 0xc != lVar3);
  }
  return;
}

Assistant:

void EPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const {
    for(int i = 0; i < numEvents; ++i) {
        int fd = events_[i].data.fd;
        auto it = channels_.find(fd);
        assert(it != channels_.end());
        auto channel = it->second;
        channel->setRevents(events_[i].events);
        activeChannels->push_back(channel);
    } 
}